

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O0

int os_tmpname(lua_State *L)

{
  int __fd;
  char local_38 [4];
  int err;
  char buff [32];
  lua_State *L_local;
  
  buff._24_8_ = L;
  strcpy(local_38,"/tmp/lua_XXXXXX");
  __fd = mkstemp64(local_38);
  if (__fd == -1) {
    L_local._4_4_ = luaL_error((lua_State *)buff._24_8_,"unable to generate a unique filename");
  }
  else {
    close(__fd);
    lua_pushstring((lua_State *)buff._24_8_,local_38);
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int os_tmpname (lua_State *L) {
  char buff[LUA_TMPNAMBUFSIZE];
  int err;
  lua_tmpnam(buff, err);
  if (err)
    return luaL_error(L, "unable to generate a unique filename");
  lua_pushstring(L, buff);
  return 1;
}